

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

void Abc_ZddPrint_rec(Abc_ZddMan *p,int a,int *pPath,int Size)

{
  int Size_00;
  Abc_ZddObj *pAVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  uint local_f8 [24];
  int local_98 [26];
  
  puVar4 = (uint *)(pPath + Size);
  while( true ) {
    if (a == 0) {
      return;
    }
    if (a == 1) break;
    pAVar1 = p->pObjs;
    Abc_ZddPrint_rec(p,pAVar1[a].False,pPath,Size);
    *puVar4 = *(uint *)(pAVar1 + a) & 0x7fffffff;
    a = pAVar1[a].True;
    Size = Size + 1;
    puVar4 = puVar4 + 1;
  }
  if (p->nPermSize < 0x19) {
    uVar2 = 0;
    uVar3 = 0;
    if (0 < Size) {
      uVar3 = (ulong)(uint)Size;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      local_f8[uVar2] = p->pV2TI[pPath[uVar2]] << 0x10 | p->pV2TJ[pPath[uVar2]];
    }
    Abc_ZddCombPrint((int *)local_f8,Size);
    Size_00 = p->nPermSize;
    Abc_ZddComb2Perm((int *)local_f8,Size,local_98,Size_00);
    Abc_ZddPermPrint(local_98,Size_00);
    return;
  }
  __assert_fail("p->nPermSize <= 24",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                ,0x2b3,"void Abc_ZddPrint_rec(Abc_ZddMan *, int, int *, int)");
}

Assistant:

void Abc_ZddPrint_rec( Abc_ZddMan * p, int a, int * pPath, int Size )
{
    Abc_ZddObj * A;  
    if ( a == 0 ) return;
//    if ( a == 1 ) { Abc_ZddPermPrint( pPath, Size ); return; }
    if ( a == 1 )
    { 
        int pPerm[24], pComb[24], i;
        assert( p->nPermSize <= 24 );
        for ( i = 0; i < Size; i++ )
            pComb[i] = (p->pV2TI[pPath[i]] << 16) | p->pV2TJ[pPath[i]];
        Abc_ZddCombPrint( pComb, Size ); 
        Abc_ZddComb2Perm( pComb, Size, pPerm, p->nPermSize );
        Abc_ZddPermPrint( pPerm, p->nPermSize );
        return; 
    }
    A = Abc_ZddNode( p, a );
    Abc_ZddPrint_rec( p, A->False, pPath, Size );
    pPath[Size] = A->Var;
    Abc_ZddPrint_rec( p, A->True, pPath, Size + 1 );
}